

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Time.cpp
# Opt level: O2

void __thiscall
axl::sys::Time::setTimestampImpl(Time *this,uint64_t timestamp,bool isLocal,int timeZone)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined7 in_register_00000011;
  time64_t posixTime;
  tm tmStruct;
  
  posixTime = timestamp / 10000000 - 0x2b6109100;
  if ((int)CONCAT71(in_register_00000011,isLocal) == 0) {
    if (timeZone - 100U < 0xffffff39) {
      iVar3 = (timeZone / 100) * -0x28 + timeZone;
    }
    else {
      iVar3 = timeZone * 0x3c;
    }
    posixTime = posixTime + iVar3 * 0x3c;
    gmtime_r(&posixTime,(tm *)&tmStruct);
  }
  else {
    localtime_r(&posixTime,(tm *)&tmStruct);
  }
  this->m_year = (short)tmStruct.tm_year + 0x76c;
  this->m_month = (uint16_t)tmStruct.tm_mon;
  this->m_monthDay = (uint16_t)tmStruct.tm_mday;
  this->m_dayOfWeek = (uint16_t)tmStruct.tm_wday;
  this->m_hour = (uint16_t)tmStruct.tm_hour;
  this->m_minute = (uint16_t)tmStruct.tm_min;
  this->m_second = (uint16_t)tmStruct.tm_sec;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = timestamp / 10000;
  this->m_milliSecond = SUB162(auVar1 % ZEXT816(1000),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = timestamp / 10;
  this->m_microSecond = SUB162(auVar2 % ZEXT816(1000),0);
  this->m_nanoSecond = (short)(timestamp % 10) * 100;
  return;
}

Assistant:

void
Time::setTimestampImpl(
	uint64_t timestamp,
	bool isLocal,
	int timeZone
) {
#if (_AXL_OS_WIN)
	SYSTEMTIME sysTime = { 0 };

	if (isLocal)
		::FileTimeToLocalFileTime((const FILETIME*)&timestamp, (FILETIME*)&timestamp);
	else
		timestamp += (int64_t)getTimeZoneOffsetInMinutes(timeZone) * 60 * 10000000;

	::FileTimeToSystemTime((const FILETIME*)&timestamp, &sysTime);

	m_year        = sysTime.wYear;
	m_month       = sysTime.wMonth - 1;
	m_monthDay    = sysTime.wDay;
	m_dayOfWeek   = sysTime.wDayOfWeek;
	m_hour        = sysTime.wHour;
	m_minute      = sysTime.wMinute;
	m_second      = sysTime.wSecond;

#else
	struct tm tmStruct;

	time64_t posixTime = timestamp / 10000000 - AXL_SYS_EPOCH_DIFF;

	if (isLocal) {
		localtime64_r(&posixTime, &tmStruct);
	} else {
		posixTime += getTimeZoneOffsetInMinutes(timeZone) * 60;
		gmtime64_r(&posixTime, &tmStruct);
	}

	m_year        = tmStruct.tm_year + 1900;
	m_month       = tmStruct.tm_mon;
	m_monthDay    = tmStruct.tm_mday;
	m_dayOfWeek   = tmStruct.tm_wday;
	m_hour        = tmStruct.tm_hour;
	m_minute      = tmStruct.tm_min;
	m_second      = tmStruct.tm_sec;
#endif

	m_milliSecond = (timestamp / 10000) % 1000;
	m_microSecond = (timestamp / 10) % 1000;
	m_nanoSecond  = (timestamp % 10) * 100;
}